

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O1

charcount_t __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::LineLength
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,EncodedCharPtr first,EncodedCharPtr last,
          size_t *cb)

{
  code *pcVar1;
  EncodedCharPtr puVar2;
  bool bVar3;
  OLECHAR OVar4;
  undefined4 *puVar5;
  undefined4 *unaff_RBX;
  undefined4 *puVar6;
  EncodedCharPtr local_38;
  EncodedCharPtr p;
  
  if (cb == (size_t *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    unaff_RBX = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *unaff_RBX = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,199,"(cb != nullptr)","cb != nullptr");
    if (!bVar3) {
LAB_00f157c3:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *unaff_RBX = 0;
  }
  puVar6 = (undefined4 *)0x0;
  local_38 = first;
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  do {
    puVar2 = local_38;
    OVar4 = UTF8EncodingPolicyBase<false>::ReadFull<false>
                      (&this->super_UTF8EncodingPolicyBase<false>,&local_38,last);
    if ((((ushort)OVar4 < 0xe) && ((0x2401U >> ((ushort)OVar4 & 0x1f) & 1) != 0)) ||
       ((ushort)OVar4 - 0x2028 < 2)) {
      if (puVar2 < first) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                           ,0xdb,"(prev >= first)","prev >= first");
        if (!bVar3) goto LAB_00f157c3;
        *puVar5 = 0;
      }
      *cb = (long)puVar2 - (long)first;
      bVar3 = false;
      unaff_RBX = puVar6;
    }
    else {
      puVar6 = (undefined4 *)(ulong)((int)puVar6 + 1);
      bVar3 = true;
    }
    if (!bVar3) {
      return (charcount_t)unaff_RBX;
    }
  } while( true );
}

Assistant:

charcount_t Scanner<EncodingPolicy>::LineLength(EncodedCharPtr first, EncodedCharPtr last, size_t* cb)
{
    Assert(cb != nullptr);

    charcount_t result = 0;
    EncodedCharPtr p = first;

    for (;;)
    {
        EncodedCharPtr prev = p;
        switch( this->template ReadFull<false>(p, last) )
        {
            case kchNWL: // _C_NWL
            case kchRET:
            case kchLS:
            case kchPS:
            case kchNUL: // _C_NUL
                // p is now advanced past the line terminator character.
                // We need to know the number of bytes making up the line, not including the line terminator character.
                // To avoid subtracting a variable number of bytes because the line terminator characters are different
                // number of bytes long (plus there may be multiple valid encodings for these characters) just keep
                // track of the first byte of the line terminator character in prev.
                Assert(prev >= first);
                *cb = prev - first;
                return result;
        }
        result++;
    }
}